

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
::clear(sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
        *this)

{
  char cVar1;
  EntryPointer psVar2;
  size_t sVar3;
  void *pvVar4;
  long lVar5;
  
  psVar2 = this->entries;
  sVar3 = this->num_slots_minus_one;
  cVar1 = this->max_lookups;
  if (psVar2 != psVar2 + sVar3 + (long)cVar1) {
    lVar5 = 0;
    do {
      if (-1 < (&psVar2->distance_from_desired)[lVar5]) {
        if (((0x40 < *(uint *)((long)&psVar2->field_1 + lVar5 + 8)) ||
            ((*(byte *)((long)&psVar2->field_1 + lVar5 + 0xd) & 1) != 0)) &&
           (pvVar4 = *(void **)((long)&psVar2->field_1 + lVar5), pvVar4 != (void *)0x0)) {
          operator_delete__(pvVar4);
        }
        (&psVar2->distance_from_desired)[lVar5] = -1;
      }
      lVar5 = lVar5 + 0x18;
    } while ((long)cVar1 * 0x18 + sVar3 * 0x18 != lVar5);
  }
  this->num_elements = 0;
  return;
}

Assistant:

[[clang::reinitializes]]
    void clear()
    {
        for (EntryPointer it = entries, end = it + static_cast<ptrdiff_t>(num_slots_minus_one + max_lookups); it != end; ++it)
        {
            if (it->has_value())
                it->destroy_value();
        }
        num_elements = 0;
    }